

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O1

void MyGame_Example_Any_print_json_union_type(flatcc_json_printer_t *ctx,flatbuffers_utype_t type)

{
  undefined7 in_register_00000031;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    flatcc_json_printer_enum(ctx,"Monster",7);
    return;
  case 2:
    flatcc_json_printer_enum(ctx,"TestSimpleTableWithEnum",0x17);
    return;
  case 3:
    flatcc_json_printer_enum(ctx,"Monster2",8);
    return;
  case 4:
    flatcc_json_printer_enum(ctx,"Alt",3);
    return;
  default:
    flatcc_json_printer_enum(ctx,"NONE",4);
    return;
  }
}

Assistant:

static void MyGame_Example_Any_print_json_union_type(flatcc_json_printer_t *ctx, flatbuffers_utype_t type)
{
    switch (type) {
    case 1:
        flatcc_json_printer_enum(ctx, "Monster", 7);
        break;
    case 2:
        flatcc_json_printer_enum(ctx, "TestSimpleTableWithEnum", 23);
        break;
    case 3:
        flatcc_json_printer_enum(ctx, "Monster2", 8);
        break;
    case 4:
        flatcc_json_printer_enum(ctx, "Alt", 3);
        break;
    default:
        flatcc_json_printer_enum(ctx, "NONE", 4);
        break;
    }
}